

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RDI;
  Option *in_stack_00000088;
  Mat *in_stack_00000090;
  Mat *in_stack_00000098;
  int local_4;
  
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_abs>
                        (in_stack_00000098,(Option *)in_stack_00000090);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_neg>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 2) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_floor>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 3) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_ceil>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_square>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 5) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_sqrt>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 6) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_rsqrt>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 7) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_exp>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_log>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 9) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_sin>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 10) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_cos>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0xb) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_tan>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0xc) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_asin>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0xd) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_acos>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0xe) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_atan>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0xf) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_reciprocal>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0x10) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_tanh>
                        (in_stack_00000090,in_stack_00000088);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 0x11) {
    local_4 = unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_log10>
                        (in_stack_00000090,in_stack_00000088);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    return 0;
}